

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O3

Error __thiscall asmjit::ConstPool::add(ConstPool *this,void *data,size_t size,size_t *dstOffset)

{
  size_t sVar1;
  Gap *pGVar2;
  Zone *pZVar3;
  Error EVar4;
  uint uVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  Node *pNVar9;
  ulong uVar10;
  void *__s2;
  Tree *pTVar11;
  bool bVar12;
  Compare cmp;
  long local_78;
  ulong local_70;
  Compare local_50;
  Tree *local_48;
  ulong local_40;
  ConstPool *local_38;
  
  EVar4 = 2;
  switch(size) {
  case 1:
    bVar12 = false;
    lVar6 = 0;
    goto LAB_00116745;
  case 2:
    lVar6 = 1;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
    goto switchD_00116702_caseD_3;
  case 4:
    lVar6 = 2;
    break;
  case 8:
    lVar6 = 3;
    break;
  default:
    if (size != 0x20) {
      if (size != 0x10) {
        return 2;
      }
      lVar6 = 4;
      break;
    }
    lVar6 = 5;
    bVar12 = true;
    goto LAB_00116745;
  }
  bVar12 = false;
LAB_00116745:
  pNVar9 = this->_tree[lVar6]._tree._root;
  if (pNVar9 == (Node *)0x0) {
LAB_00116794:
    if (bVar12) {
LAB_00116811:
      local_70 = this->_size;
      sVar7 = (-size & (size + local_70) - 1) - local_70;
      if (sVar7 != 0) {
        ConstPool_addGap(this,local_70,sVar7);
        local_70 = sVar7 + this->_size;
      }
      this->_size = local_70 + size;
    }
    else {
      lVar8 = lVar6 + -5;
      local_70 = 0xffffffffffffffff;
      do {
        pGVar2 = this->_gaps[lVar6];
        if (pGVar2 != (Gap *)0x0) {
          local_70 = pGVar2->_offset;
          sVar7 = pGVar2->_size;
          this->_gaps[lVar6] = pGVar2->_next;
          pGVar2->_next = this->_gapPool;
          this->_gapPool = pGVar2;
          if (local_70 % size != 0) goto LAB_00116a89;
          sVar7 = sVar7 - size;
          if (sVar7 != 0) {
            ConstPool_addGap(this,local_70,sVar7);
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0);
      if (local_70 == 0xffffffffffffffff) goto LAB_00116811;
    }
    pZVar3 = this->_zone;
    pNVar9 = (Node *)((ulong)(pZVar3->_ptr + 7) & 0xfffffffffffffff8);
    if (pNVar9 < (Node *)pZVar3->_end && size + 0x18 <= (ulong)((long)pZVar3->_end - (long)pNVar9))
    {
      pZVar3->_ptr = (uint8_t *)
                     ((long)pNVar9[1].super_ZoneTreeNodeT<asmjit::ConstPool::Node>.
                            super_ZoneTreeNode._rbNodeData + size);
    }
    else {
      pNVar9 = (Node *)Zone::_alloc(pZVar3,size + 0x18,8);
    }
    if (pNVar9 == (Node *)0x0) {
      return 1;
    }
    (pNVar9->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode._rbNodeData[0] = 0;
    (pNVar9->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode._rbNodeData[1] = 0;
    pNVar9->field_0x10 = pNVar9->field_0x10 & 0xfe;
    pTVar11 = this->_tree + lVar6;
    pNVar9->_offset = (uint32_t)local_70;
    memcpy(pNVar9 + 1,data,size);
    local_50._dataSize = pTVar11->_dataSize;
    ZoneTree<asmjit::ConstPool::Node>::insert<asmjit::ConstPool::Compare>
              (&pTVar11->_tree,pNVar9,&local_50);
    pTVar11->_size = pTVar11->_size + 1;
    uVar10 = this->_alignment;
    if (this->_alignment <= size) {
      uVar10 = size;
    }
    this->_alignment = uVar10;
    *dstOffset = local_70;
    if (4 < size) {
      local_48 = this->_tree;
      local_78 = 1;
      local_38 = this;
      do {
        bVar12 = lVar6 == 0;
        lVar6 = lVar6 + -1;
        if (bVar12) {
          add();
LAB_00116a89:
          add();
          return 1;
        }
        uVar10 = size >> 1;
        local_78 = local_78 * 2;
        local_40 = size;
        if (local_78 != 0) {
          pTVar11 = local_48 + lVar6;
          lVar8 = 0;
          __s2 = data;
          do {
            pNVar9 = (pTVar11->_tree)._root;
            if (pNVar9 == (Node *)0x0) {
LAB_001169a5:
              pZVar3 = local_38->_zone;
              pNVar9 = (Node *)((ulong)(pZVar3->_ptr + 7) & 0xfffffffffffffff8);
              if (pNVar9 < (Node *)pZVar3->_end &&
                  uVar10 + 0x18 <= (ulong)((long)pZVar3->_end - (long)pNVar9)) {
                pZVar3->_ptr = (uint8_t *)
                               ((long)pNVar9[1].super_ZoneTreeNodeT<asmjit::ConstPool::Node>.
                                      super_ZoneTreeNode._rbNodeData + uVar10);
              }
              else {
                pNVar9 = (Node *)Zone::_alloc(pZVar3,uVar10 + 0x18,8);
              }
              if (pNVar9 != (Node *)0x0) {
                (pNVar9->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode.
                _rbNodeData[0] = 0;
                (pNVar9->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode.
                _rbNodeData[1] = 0;
                pNVar9->field_0x10 = pNVar9->field_0x10 | 1;
                pNVar9->_offset = (int)lVar8 * (int)uVar10 + (uint32_t)local_70;
                memcpy(pNVar9 + 1,__s2,uVar10);
              }
              local_50._dataSize = pTVar11->_dataSize;
              ZoneTree<asmjit::ConstPool::Node>::insert<asmjit::ConstPool::Compare>
                        (&pTVar11->_tree,pNVar9,&local_50);
              pTVar11->_size = pTVar11->_size + 1;
            }
            else {
              sVar1 = pTVar11->_dataSize;
              do {
                uVar5 = memcmp(pNVar9 + 1,__s2,sVar1);
                if (uVar5 == 0) break;
                pNVar9 = (Node *)((pNVar9->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                                  super_ZoneTreeNode._rbNodeData[uVar5 >> 0x1f] & 0xfffffffffffffffe
                                 );
              } while (pNVar9 != (Node *)0x0);
              if (pNVar9 == (Node *)0x0) goto LAB_001169a5;
            }
            lVar8 = lVar8 + 1;
            __s2 = (void *)((long)__s2 + uVar10);
          } while (lVar8 != local_78);
        }
        size = uVar10;
      } while (9 < local_40);
    }
  }
  else {
    sVar1 = this->_tree[lVar6]._dataSize;
    do {
      uVar5 = memcmp(pNVar9 + 1,data,sVar1);
      if (uVar5 == 0) break;
      pNVar9 = (Node *)((pNVar9->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode.
                        _rbNodeData[uVar5 >> 0x1f] & 0xfffffffffffffffe);
    } while (pNVar9 != (Node *)0x0);
    if (pNVar9 == (Node *)0x0) goto LAB_00116794;
    *dstOffset = (ulong)pNVar9->_offset;
  }
  EVar4 = 0;
switchD_00116702_caseD_3:
  return EVar4;
}

Assistant:

Error ConstPool::add(const void* data, size_t size, size_t& dstOffset) noexcept {
  size_t treeIndex;

  if (size == 32)
    treeIndex = kIndex32;
  else if (size == 16)
    treeIndex = kIndex16;
  else if (size == 8)
    treeIndex = kIndex8;
  else if (size == 4)
    treeIndex = kIndex4;
  else if (size == 2)
    treeIndex = kIndex2;
  else if (size == 1)
    treeIndex = kIndex1;
  else
    return DebugUtils::errored(kErrorInvalidArgument);

  ConstPool::Node* node = _tree[treeIndex].get(data);
  if (node) {
    dstOffset = node->_offset;
    return kErrorOk;
  }

  // Before incrementing the current offset try if there is a gap that can
  // be used for the requested data.
  size_t offset = ~size_t(0);
  size_t gapIndex = treeIndex;

  while (gapIndex != kIndexCount - 1) {
    ConstPool::Gap* gap = _gaps[treeIndex];

    // Check if there is a gap.
    if (gap) {
      size_t gapOffset = gap->_offset;
      size_t gapSize = gap->_size;

      // Destroy the gap for now.
      _gaps[treeIndex] = gap->_next;
      ConstPool_freeGap(this, gap);

      offset = gapOffset;
      ASMJIT_ASSERT(Support::isAligned<size_t>(offset, size));

      gapSize -= size;
      if (gapSize > 0)
        ConstPool_addGap(this, gapOffset, gapSize);
    }

    gapIndex++;
  }

  if (offset == ~size_t(0)) {
    // Get how many bytes have to be skipped so the address is aligned accordingly
    // to the 'size'.
    size_t diff = Support::alignUpDiff<size_t>(_size, size);

    if (diff != 0) {
      ConstPool_addGap(this, _size, diff);
      _size += diff;
    }

    offset = _size;
    _size += size;
  }

  // Add the initial node to the right index.
  node = ConstPool::Tree::_newNode(_zone, data, size, offset, false);
  if (!node) return DebugUtils::errored(kErrorOutOfMemory);

  _tree[treeIndex].insert(node);
  _alignment = Support::max<size_t>(_alignment, size);

  dstOffset = offset;

  // Now create a bunch of shared constants that are based on the data pattern.
  // We stop at size 4, it probably doesn't make sense to split constants down
  // to 1 byte.
  size_t pCount = 1;
  while (size > 4) {
    size >>= 1;
    pCount <<= 1;

    ASMJIT_ASSERT(treeIndex != 0);
    treeIndex--;

    const uint8_t* pData = static_cast<const uint8_t*>(data);
    for (size_t i = 0; i < pCount; i++, pData += size) {
      node = _tree[treeIndex].get(pData);
      if (node) continue;

      node = ConstPool::Tree::_newNode(_zone, pData, size, offset + (i * size), true);
      _tree[treeIndex].insert(node);
    }
  }

  return kErrorOk;
}